

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfd_coin_selection.cpp
# Opt level: O3

CoinSelectionOption * GetElementsOption(void)

{
  CoinSelectionOption *extraout_RAX;
  CoinSelectionOption *in_RDI;
  
  cfd::CoinSelectionOption::CoinSelectionOption(in_RDI);
  cfd::CoinSelectionOption::InitializeConfidentialTxSizeInfo(in_RDI);
  return extraout_RAX;
}

Assistant:

static CoinSelectionOption GetElementsOption() {
  CoinSelectionOption option;
  option.InitializeConfidentialTxSizeInfo();
  return option;
}